

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrate.c
# Opt level: O1

void xc_rdqagse(integr_fn *f,void *ex,double *a,double *b,double *epsabs,double *epsrel,int *limit,
               double *result,double *abserr,int *neval,int *ier,double *alist__,double *blist,
               double *rlist,double *elist,int *iord,int *last)

{
  undefined1 auVar1 [16];
  double dVar2;
  bool bVar3;
  integr_fn *f_00;
  void *ex_00;
  int iVar4;
  long lVar5;
  int *piVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  int iVar15;
  uint uVar16;
  long lVar17;
  long lVar18;
  ulong uVar19;
  double *pdVar20;
  uint uVar21;
  long lVar22;
  uint uVar23;
  int iVar24;
  int iVar25;
  bool bVar26;
  ulong uVar27;
  double dVar28;
  double dVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  double dVar32;
  double dVar33;
  undefined1 auVar34 [16];
  undefined4 uVar35;
  undefined4 uVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  undefined1 auVar43 [16];
  double dVar45;
  undefined1 auVar44 [16];
  double dVar46;
  double dVar47;
  int local_390;
  int local_36c;
  double local_368;
  double local_338;
  double local_318;
  double resabs;
  double local_2d8;
  double dStack_2d0;
  double local_2c8;
  undefined8 uStack_2c0;
  double local_2b8;
  undefined8 uStack_2b0;
  double local_2a8;
  undefined8 uStack_2a0;
  double local_298;
  undefined8 uStack_290;
  double *local_288;
  double *local_280;
  integr_fn *local_278;
  void *local_270;
  double error2;
  double error1;
  double defab2;
  double defab1;
  double b2;
  double b1;
  double a2;
  double a1;
  double area2;
  double area1;
  double local_218;
  double dStack_210;
  double dStack_208;
  double local_1f8;
  double adStack_1f0 [2];
  double defabs;
  double rlist2 [52];
  
  *ier = 0;
  *neval = 0;
  *last = 0;
  *result = 0.0;
  *abserr = 0.0;
  *alist__ = *a;
  *blist = *b;
  *rlist = 0.0;
  *elist = 0.0;
  if ((*epsabs <= 0.0) && (*epsrel <= 1.1102230246251565e-14 && *epsrel != 1.1102230246251565e-14))
  {
    *ier = 6;
    return;
  }
  local_288 = a;
  local_280 = b;
  local_278 = f;
  local_270 = ex;
  rdqk21(f,ex,a,b,result,abserr,&defabs,&resabs);
  dVar29 = *result;
  local_1f8 = ABS(dVar29);
  dVar33 = *epsrel * local_1f8;
  if (*epsrel * local_1f8 <= *epsabs) {
    dVar33 = *epsabs;
  }
  *last = 1;
  *rlist = dVar29;
  *elist = *abserr;
  *iord = 1;
  local_298 = *abserr;
  uStack_290 = 0;
  if ((local_298 <= defabs * 2.220446049250313e-14) && (dVar33 < local_298)) {
    *ier = 2;
  }
  if (*limit == 1) {
    *ier = 1;
  }
  if ((*ier != 0) ||
     (((local_298 == 0.0 && (!NAN(local_298))) ||
      (adStack_1f0[0] = 0.0, local_298 <= dVar33 && resabs != local_298)))) goto LAB_006cdafb;
  dVar29 = *result;
  *abserr = 1.79769313486232e+308;
  *last = 2;
  if (1 < *limit) {
    uVar10 = 2;
    uVar19 = 1;
    bVar26 = false;
    local_318 = 0.0;
    bVar3 = false;
    local_36c = 0;
    iVar12 = 0;
    iVar7 = 0;
    local_390 = 0;
    iVar25 = 0;
    uVar11 = 1;
    iVar4 = 0;
    local_2d8 = 0.0;
    dStack_2d0 = 0.0;
    local_368 = 0.0;
    local_338 = 0.0;
    uVar35 = SUB84(local_298,0);
    uVar36 = (undefined4)((ulong)local_298 >> 0x20);
    rlist2[0] = dVar29;
LAB_006cdc25:
    ex_00 = local_270;
    f_00 = local_278;
    dVar33 = (double)CONCAT44(uVar36,uVar35);
    iVar15 = (int)uVar19;
    local_2b8 = alist__[(long)iVar15 + -1];
    local_2c8 = blist[(long)iVar15 + -1];
    uStack_2b0 = 0;
    local_2a8 = (local_2b8 + local_2c8) * 0.5;
    uStack_2a0 = 0;
    uStack_2c0 = 0;
    b2 = local_2c8;
    b1 = local_2a8;
    a2 = local_2a8;
    a1 = local_2b8;
    rdqk21(local_278,local_270,&a1,&b1,&area1,&error1,&resabs,&defab1);
    rdqk21(f_00,ex_00,&a2,&b2,&area2,&error2,&resabs,&defab2);
    dVar32 = area1 + area2;
    uVar35 = SUB84(error1,0);
    uVar36 = (undefined4)((ulong)error1 >> 0x20);
    dVar28 = error1 + error2;
    if ((defab1 != error1) || (NAN(defab1) || NAN(error1))) {
      if ((defab2 != error2) || (NAN(defab2) || NAN(error2))) {
        if ((ABS(rlist[(long)iVar15 + -1] - dVar32) <= ABS(dVar32) * 1e-05) &&
           (dVar33 * 0.99 <= dVar28)) {
          iVar12 = iVar12 + (uint)bVar3;
          iVar7 = iVar7 + (uint)!bVar3;
        }
        local_36c = local_36c + (uint)(dVar33 < dVar28 && 10 < *last);
      }
    }
    dVar29 = (dVar29 + dVar32) - rlist[(long)iVar15 + -1];
    rlist[(long)iVar15 + -1] = area1;
    rlist[(long)*last + -1] = area2;
    dVar32 = ABS(dVar29) * *epsrel;
    if (ABS(dVar29) * *epsrel <= *epsabs) {
      dVar32 = *epsabs;
    }
    if ((9 < iVar12 + iVar7) || (0x13 < local_36c)) {
      *ier = 2;
    }
    if (4 < iVar12) {
      iVar25 = 3;
    }
    dVar37 = ABS(local_2c8);
    if (ABS(local_2c8) <= ABS(local_2b8)) {
      dVar37 = ABS(local_2b8);
    }
    dVar40 = (ABS(local_2a8) + 2.2250738585072014e-305) * 1.0000000000000222;
    if ((dVar37 <= dVar40) || (*last == *limit)) {
      *ier = (uint)(dVar37 <= dVar40) * 3 + 1;
    }
    if (error2 <= error1) {
      lVar5 = (long)*last;
      alist__[lVar5 + -1] = local_2a8;
      blist[(long)iVar15 + -1] = local_2a8;
      blist[lVar5 + -1] = local_2c8;
      uVar35 = SUB84(error2,0);
      uVar36 = (undefined4)((ulong)error2 >> 0x20);
      dVar37 = error1;
    }
    else {
      alist__[(long)iVar15 + -1] = local_2a8;
      lVar5 = (long)*last;
      alist__[lVar5 + -1] = local_2b8;
      blist[lVar5 + -1] = local_2a8;
      rlist[(long)iVar15 + -1] = area2;
      rlist[lVar5 + -1] = area1;
      dVar37 = error2;
    }
    elist[(long)iVar15 + -1] = dVar37;
    elist[lVar5 + -1] = (double)CONCAT44(uVar36,uVar35);
    if (*last < 3) {
      iord[0] = 1;
      iord[1] = 2;
    }
    else {
      dVar37 = elist[(long)iVar15 + -1];
      if (1 < (int)uVar11) {
        piVar6 = iord + ((uVar11 & 0xffffffff) - 1);
        do {
          if (dVar37 <= elist[(long)piVar6[-1] + -1]) goto LAB_006ce0d7;
          *piVar6 = piVar6[-1];
          uVar23 = (int)uVar11 - 1;
          uVar11 = (ulong)uVar23;
          piVar6 = piVar6 + -1;
        } while (uVar23 != 1);
        uVar11 = 1;
      }
LAB_006ce0d7:
      iVar8 = *last;
      iVar13 = (*limit - iVar8) + 3;
      if (iVar8 <= *limit / 2 + 2) {
        iVar13 = iVar8;
      }
      iVar24 = (int)uVar11;
      uVar11 = uVar11 & 0xffffffff;
      lVar5 = (long)iVar13;
      if (iVar24 < iVar13 + -1) {
        dVar40 = elist[(long)iVar8 + -1];
        lVar17 = (long)iVar24;
        lVar22 = uVar11 << 0x20;
        lVar18 = 1;
        do {
          if (elist[(long)iord[lVar17 + lVar18 + -1] + -1] <= dVar37) {
            uVar19 = uVar11 + lVar18;
            *(int *)((long)iord + (lVar22 >> 0x1e) + -4) = iVar15;
            if (iVar13 <= (int)uVar19) goto LAB_006ce1c0;
            piVar6 = iord + lVar5 + -1;
            goto LAB_006ce1a0;
          }
          iord[lVar17 + lVar18 + -2] = iord[lVar17 + lVar18 + -1];
          lVar18 = lVar18 + 1;
          lVar22 = lVar22 + 0x100000000;
        } while (lVar5 - lVar17 != lVar18);
      }
      iord[(long)(iVar13 + -1) + -1] = iVar15;
      iord[lVar5 + -1] = *last;
    }
    goto LAB_006ce1e4;
  }
  local_338 = 0.0;
  iVar25 = 0;
LAB_006ce7ef:
  dVar33 = *abserr;
  if ((dVar33 == 1.79769313486232e+308) && (!NAN(dVar33))) goto LAB_006ce8ea;
  iVar12 = *ier;
  if (iVar12 + iVar25 == 0) {
LAB_006ce849:
    if (local_1f8 < defabs * 0.9999999999999889) {
      dVar33 = ABS(dVar29);
      if (ABS(dVar29) <= ABS(*result)) {
        dVar33 = ABS(*result);
      }
      if (dVar33 <= defabs * 0.01) goto LAB_006ce914;
    }
    if (((*result / dVar29 < 0.01) || (100.0 < *result / dVar29)) || (ABS(dVar29) < local_298)) {
      *ier = 5;
    }
  }
  else {
    if (iVar25 == 3) {
      *abserr = local_338 + dVar33;
    }
    if (iVar12 == 0) {
      *ier = 3;
    }
    dVar33 = *result;
    if (((dVar33 == 0.0) && (!NAN(dVar33))) || ((dVar29 == 0.0 && (!NAN(dVar29))))) {
      if (*abserr <= local_298) {
        if ((dVar29 != 0.0) || (NAN(dVar29))) goto LAB_006ce849;
        goto LAB_006ce914;
      }
    }
    else {
      auVar34._0_8_ = ABS(dVar33);
      auVar34._8_8_ = ABS(dVar29);
      auVar30._8_8_ = local_298;
      auVar30._0_8_ = *abserr;
      auVar31 = divpd(auVar30,auVar34);
      if (auVar31._0_8_ <= auVar31._8_8_) goto LAB_006ce849;
    }
LAB_006ce8ea:
    *result = 0.0;
    uVar10 = *last;
    if (0 < (int)uVar10) {
      dVar29 = *result;
      uVar11 = 0;
      do {
        dVar29 = dVar29 + rlist[uVar11];
        *result = dVar29;
        uVar11 = uVar11 + 1;
      } while (uVar10 != uVar11);
    }
    *abserr = local_298;
  }
LAB_006ce914:
  if (*ier < 3) {
    return;
  }
LAB_006cdafb:
  *neval = *last * 0x2a + -0x15;
  return;
  while( true ) {
    *piVar6 = piVar6[-1];
    uVar23 = (int)uVar19 + 1;
    uVar19 = (ulong)uVar23;
    piVar6 = piVar6 + -1;
    if (iVar13 <= (int)uVar23) break;
LAB_006ce1a0:
    if (dVar40 < elist[(long)piVar6[-1] + -1]) {
      *piVar6 = *last;
      goto LAB_006ce1e4;
    }
  }
LAB_006ce1c0:
  iord[lVar17 + lVar18 + -1] = *last;
LAB_006ce1e4:
  local_298 = (local_298 + dVar28) - dVar33;
  if (local_298 <= dVar32) goto LAB_006ce8ea;
  if (*ier != 0) goto LAB_006ce7ef;
  iVar8 = (int)uVar11;
  uVar23 = iord[(long)iVar8 + -1];
  uVar19 = (ulong)uVar23;
  uVar35 = SUB84(elist[(long)(int)uVar23 + -1],0);
  uVar36 = (undefined4)((ulong)elist[(long)(int)uVar23 + -1] >> 0x20);
  iVar15 = *last;
  if (iVar15 == 2) {
    local_318 = ABS(*local_280 - *local_288) * 0.375;
    local_368 = local_298;
    local_2d8 = dVar32;
    dStack_2d0 = 0.0;
    rlist2[1] = dVar29;
  }
  else if (bVar26) {
    bVar26 = true;
  }
  else {
    uVar27 = -(ulong)(local_318 < ABS(local_2a8 - local_2b8));
    local_368 = (double)(~uVar27 & (ulong)(local_368 - dVar33) |
                        (ulong)(dVar28 + (local_368 - dVar33)) & uVar27);
    if (!bVar3) {
      iVar8 = 2;
      bVar3 = false;
      if (local_318 < ABS(blist[(long)(int)uVar23 + -1] - alist__[(long)(int)uVar23 + -1])) {
        bVar26 = false;
        goto LAB_006ce7cc;
      }
    }
    if ((iVar25 != 3) && (local_2d8 < local_368)) {
      iVar13 = (*limit - iVar15) + 3;
      if (iVar15 <= *limit / 2 + 2) {
        iVar13 = iVar15;
      }
      if (iVar8 <= iVar13) {
        uVar11 = (ulong)iVar8;
        iVar8 = iVar8 + -1;
        do {
          uVar23 = iord[uVar11 - 1];
          uVar19 = (ulong)uVar23;
          if (local_318 < ABS(blist[(long)(int)uVar23 + -1] - alist__[(long)(int)uVar23 + -1])) {
            uVar35 = SUB84(elist[(long)(int)uVar23 + -1],0);
            uVar36 = (undefined4)((ulong)elist[(long)(int)uVar23 + -1] >> 0x20);
            bVar26 = false;
            bVar3 = true;
            goto LAB_006ce7cc;
          }
          uVar11 = uVar11 + 1;
          iVar8 = iVar8 + 1;
        } while (iVar8 < iVar13);
      }
    }
    uVar9 = uVar10 + 1;
    rlist2[(int)uVar10] = dVar29;
    dVar33 = rlist2[(int)uVar10];
    dVar28 = 0.0;
    uVar23 = uVar9;
    if ((int)uVar10 < 2) {
      dVar40 = 1.79769313486232e+308;
      dVar28 = 0.0;
    }
    else {
      rlist2[(ulong)uVar9 + 1] = rlist2[(ulong)uVar9 - 1];
      uVar14 = uVar10 >> 1;
      uVar16 = 1;
      if (1 < uVar14) {
        uVar16 = uVar14;
      }
      uVar21 = 0xffffffff;
      rlist2[(int)uVar10] = 1.79769313486232e+308;
      lVar5 = 0;
      dVar32 = 1.79769313486232e+308;
      do {
        dVar37 = rlist2[(ulong)uVar9 + lVar5 + 1];
        dVar40 = adStack_1f0[(ulong)uVar9 + lVar5];
        dVar2 = (adStack_1f0 + (ulong)uVar9 + lVar5)[1];
        dVar39 = dVar2 - dVar40;
        auVar43._0_8_ = ABS(dVar40);
        dVar46 = ABS(dVar2);
        dVar38 = ABS(dVar39);
        dVar40 = ABS(dVar37 - dVar2);
        auVar43._8_8_ = dVar46;
        auVar31._8_8_ = ABS(dVar37);
        auVar31._0_8_ = dVar46;
        auVar31 = maxpd(auVar43,auVar31);
        dVar41 = auVar31._0_8_ * 2.220446049250313e-16;
        dVar45 = auVar31._8_8_ * 2.220446049250313e-16;
        if ((dVar40 <= dVar45) && (dVar38 <= dVar41)) {
          dVar40 = dVar40 + dVar38;
          dVar33 = dVar37;
          dVar28 = 0.0;
          goto LAB_006ce6e1;
        }
        dVar42 = rlist2[(ulong)uVar9 + lVar5 + -1];
        rlist2[(ulong)uVar9 + lVar5 + -1] = dVar2;
        dVar47 = ABS(dVar42);
        if (dVar47 <= dVar46) {
          dVar47 = dVar46;
        }
        auVar44._8_8_ = -(ulong)(dVar45 < dVar40);
        auVar44._0_8_ = -(ulong)(dVar41 < dVar38);
        uVar21 = movmskpd(uVar21,auVar44);
        if ((((uVar21 & 2) == 0) ||
            (dVar42 = dVar2 - dVar42, ABS(dVar42) <= dVar47 * 2.220446049250313e-16)) ||
           ((uVar21 & 1) == 0)) {
LAB_006ce5c2:
          uVar23 = 1 - (int)lVar5;
          break;
        }
        auVar1._8_8_ = dVar37 - dVar2;
        auVar1._0_8_ = dVar39;
        auVar31 = divpd(_DAT_01041040,auVar1);
        dVar39 = (auVar31._8_8_ + 1.0 / dVar42) - auVar31._0_8_;
        if (ABS(dVar2 * dVar39) <= 0.0001) goto LAB_006ce5c2;
        dVar39 = dVar2 + 1.0 / dVar39;
        rlist2[(ulong)uVar9 + lVar5 + -1] = dVar39;
        dVar38 = ABS(dVar39 - dVar37) + dVar40 + dVar38;
        if (dVar38 <= dVar32) {
          dVar33 = dVar39;
          dVar28 = dVar2;
        }
        dVar32 = (double)(-(ulong)(dVar32 < dVar38) & (ulong)dVar32 |
                         ~-(ulong)(dVar32 < dVar38) & (ulong)dVar38);
        lVar5 = lVar5 + -2;
        uVar16 = uVar16 - 1;
      } while (uVar16 != 0);
      iVar15 = uVar14 + 1;
      pdVar20 = rlist2 + (ulong)(uVar10 & 1) + 2;
      do {
        pdVar20[-2] = *pdVar20;
        pdVar20 = pdVar20 + 2;
        iVar15 = iVar15 + -1;
      } while (iVar15 != 0);
      if (uVar23 == 0x32) {
        uVar23 = 0x31;
      }
      if (0 < (int)uVar23 && uVar9 != uVar23) {
        uVar11 = 0;
        do {
          rlist2[uVar11] = rlist2[((long)(int)uVar9 + uVar11) - (long)(int)uVar23];
          uVar11 = uVar11 + 1;
        } while (uVar23 != uVar11);
      }
      if (iVar4 < 3) {
        (&area1)[iVar4 + 1] = dVar33;
        dVar40 = 1.79769313486232e+308;
      }
      else {
        dVar40 = ABS(dVar33 - local_218) + ABS(dVar33 - dStack_208) + ABS(dVar33 - dStack_210);
        local_218 = dStack_210;
        dStack_210 = dStack_208;
        dStack_208 = dVar33;
      }
    }
LAB_006ce6e1:
    dVar32 = ABS(dVar33) * 1.1102230246251565e-15;
    if ((4 < local_390) && (*abserr <= local_298 * 0.001 && local_298 * 0.001 != *abserr)) {
      *ier = 5;
    }
    if (dVar32 <= dVar40) {
      dVar32 = dVar40;
    }
    if (*abserr <= dVar32) {
      local_390 = local_390 + 1;
      local_368 = local_338;
    }
    else {
      *abserr = dVar32;
      *result = dVar33;
      local_2d8 = ABS(dVar33) * *epsrel;
      if (local_2d8 <= *epsabs) {
        local_2d8 = *epsabs;
      }
      local_390 = 0;
      local_338 = local_368;
      dStack_2d0 = ABS(dVar28);
      if (*abserr <= local_2d8) goto LAB_006ce7ef;
    }
    if (*ier == 5) {
      local_338 = local_368;
      goto LAB_006ce7ef;
    }
    bVar26 = uVar23 == 1;
    uVar19 = (ulong)*iord;
    uVar35 = SUB84(elist[uVar19 - 1],0);
    uVar36 = (undefined4)((ulong)elist[uVar19 - 1] >> 0x20);
    local_318 = local_318 * 0.5;
    bVar3 = false;
    uVar11 = 1;
    local_338 = local_368;
    local_368 = local_298;
    uVar10 = uVar23;
    iVar4 = iVar4 + 1;
  }
LAB_006ce7cc:
  iVar15 = *last;
  *last = iVar15 + 1;
  if (*limit <= iVar15) goto LAB_006ce7ef;
  goto LAB_006cdc25;
}

Assistant:

GPU_FUNCTION void xc_rdqagse(integr_fn f, void *ex, double *a, double *b,
	     double *epsabs, double *epsrel, int *limit, double *result,
	     double *abserr, int *neval, int *ier, double *alist__,
	     double *blist, double *rlist, double *elist, int *iord, int *last)
{
  /* Local variables */
  int noext, extrap;
  int k,ksgn, nres;
  int ierro;
  int ktmin, nrmax;
  int iroff1, iroff2, iroff3;
  int id;
  int numrl2;
  int jupbnd;
  int maxerr;
  double res3la[3];
  double rlist2[52];
  double abseps, area, area1, area2, area12, dres, epmach;
  double a1, a2, b1, b2, defabs, defab1, defab2, oflow, uflow, resabs, reseps;
  double error1, error2, erro12, errbnd, erlast, errmax, errsum;

  double correc = 0.0, erlarg = 0.0, ertest = 0.0, small = 0.0;
  /*
 ***begin prologue  dqagse
 ***date written   800101   (yymmdd)
 ***revision date  830518   (yymmdd)
 ***category no.  h2a1a1
 ***keywords  automatic integrator, general-purpose,
              (end point) singularities, extrapolation,
              globally adaptive
 ***author  piessens,robert,appl. math. & progr. div. - k.u.leuven
            de doncker,elise,appl. math. & progr. div. - k.u.leuven
 ***purpose  the routine calculates an approximation result to a given
             definite integral i = integral of f over (a,b),
             hopefully satisfying following claim for accuracy
             abs(i-result) <= max(epsabs,epsrel*abs(i)).
 ***description

       computation of a definite integral
       standard fortran subroutine
       double precision version

       parameters
        on entry
           f      - double precision
                    function subprogram defining the integrand
                    function f(x). the actual name for f needs to be
                    declared e x t e r n a l in the driver program.

           a      - double precision
                    lower limit of integration

           b      - double precision
                    upper limit of integration

           epsabs - double precision
                    absolute accuracy requested
           epsrel - double precision
                    relative accuracy requested
                    if  epsabs <= 0
                    and epsrel < max(50*rel.mach.acc.,0.5d-28),
                    the routine will end with ier = 6.

           limit  - int
                    gives an upperbound on the number of subintervals
                    in the partition of (a,b)

        on return
           result - double precision
                    approximation to the integral

           abserr - double precision
                    estimate of the modulus of the absolute error,
                    which should equal or exceed abs(i-result)

           neval  - int
                    number of integrand evaluations

           ier    - int
                    ier = 0 normal and reliable termination of the
                            routine. it is assumed that the requested
                            accuracy has been achieved.
                    ier > 0 abnormal termination of the routine
                            the estimates for integral and error are
                            less reliable. it is assumed that the
                            requested accuracy has not been achieved.
           error messages
                        = 1 maximum number of subdivisions allowed
                            has been achieved. one can allow more sub-
                            divisions by increasing the value of limit
                            (and taking the according dimension
                            adjustments into account). however, if
                            this yields no improvement it is advised
                            to analyze the integrand in order to
                            determine the integration difficulties. if
                            the position of a local difficulty can be
                            determined (e.g. singularity,
                            discontinuity within the interval) one
                            will probably gain from splitting up the
                            interval at this point and calling the
                            integrator on the subranges. if possible,
                            an appropriate special-purpose integrator
                            should be used, which is designed for
                            handling the type of difficulty involved.
                        = 2 the occurrence of roundoff error is detec-
                            ted, which prevents the requested
                            tolerance from being achieved.
                            the error may be under-estimated.
                        = 3 extremely bad integrand behaviour
                            occurs at some points of the integration
                            interval.
                        = 4 the algorithm does not converge.
                            roundoff error is detected in the
                            extrapolation table.
                            it is presumed that the requested
                            tolerance cannot be achieved, and that the
                            returned result is the best which can be
                            obtained.
                        = 5 the integral is probably divergent, or
                            slowly convergent. it must be noted that
                            divergence can occur with any other value
                            of ier.
                        = 6 the input is invalid, because
                            epsabs <= 0 and
                            epsrel < max(50*rel.mach.acc.,0.5d-28).
                            result, abserr, neval, last, rlist(1),
                            iord(1) and elist(1) are set to zero.
                            alist(1) and blist(1) are set to a and b
                            respectively.

           alist  - double precision
                    vector of dimension at least limit, the first
                     last  elements of which are the left end points
                    of the subintervals in the partition of the
                    given integration range (a,b)

           blist  - double precision
                    vector of dimension at least limit, the first
                     last  elements of which are the right end points
                    of the subintervals in the partition of the given
                    integration range (a,b)

           rlist  - double precision
                    vector of dimension at least limit, the first
                     last  elements of which are the integral
                    approximations on the subintervals

           elist  - double precision
                    vector of dimension at least limit, the first
                     last  elements of which are the moduli of the
                    absolute error estimates on the subintervals

           iord   - int
                    vector of dimension at least limit, the first k
                    elements of which are pointers to the
                    error estimates over the subintervals,
                    such that elist(iord(1)), ..., elist(iord(k))
                    form a decreasing sequence, with k = last
                    if last <= (limit/2+2), and k = limit+1-last
                    otherwise

           last   - int
                    number of subintervals actually produced in the
                    subdivision process

 ***references  (none)
 ***routines called  dqelg,dqk21,dqpsrt
 ***end prologue  dqagse



           the dimension of rlist2 is determined by the value of
           limexp in subroutine dqelg (rlist2 should be of dimension
           (limexp+2) at least).

           list of major variables
           -----------------------

          alist     - list of left end points of all subintervals
                      considered up to now
          blist     - list of right end points of all subintervals
                      considered up to now
          rlist(i)  - approximation to the integral over
                      (alist(i),blist(i))
          rlist2    - array of dimension at least limexp+2 containing
                      the part of the epsilon table which is still
                      needed for further computations
          elist(i)  - error estimate applying to rlist(i)
          maxerr    - pointer to the interval with largest error
                      estimate
          errmax    - elist(maxerr)
          erlast    - error on the interval currently subdivided
                      (before that subdivision has taken place)
          area      - sum of the integrals over the subintervals
          errsum    - sum of the errors over the subintervals
          errbnd    - requested accuracy max(epsabs,epsrel*
                      abs(result))
          *****1    - variable for the left interval
          *****2    - variable for the right interval
          last      - index for subdivision
          nres      - number of calls to the extrapolation routine
          numrl2    - number of elements currently in rlist2. if an
                      appropriate approximation to the compounded
                      integral has been obtained it is put in
                      rlist2(numrl2) after numrl2 has been increased
                      by one.
          small     - length of the smallest interval considered up
                      to now, multiplied by 1.5
          erlarg    - sum of the errors over the intervals larger
                      than the smallest interval considered up to now
          extrap    - logical variable denoting that the routine is
                      attempting to perform extrapolation i.e. before
                      subdividing the smallest interval we try to
                      decrease the value of erlarg.
          noext     - logical variable denoting that extrapolation
                      is no longer allowed (true value)

           machine dependent constants
           ---------------------------

          epmach is the largest relative spacing.
          uflow is the smallest positive magnitude.
          oflow is the largest positive magnitude. */

  /* ***first executable statement  dqagse */
  /* Parameter adjustments */
  --iord;
  --elist;
  --rlist;
  --blist;
  --alist__;

  /* Function Body */
  epmach = DBL_EPSILON;

  /*            test on validity of parameters */
  /*            ------------------------------ */
  *ier = 0;
  *neval = 0;
  *last = 0;
  *result = 0.;
  *abserr = 0.;
  alist__[1] = *a;
  blist[1] = *b;
  rlist[1] = 0.;
  elist[1] = 0.;
  if (*epsabs <= 0. && *epsrel < m_max(epmach * 50., 5e-29)) {
    *ier = 6;
    return;
  }

  /*           first approximation to the integral */
  /*           ----------------------------------- */

  uflow = DBL_MIN;
  oflow = DBL_MAX;
  ierro = 0;
  rdqk21(f, ex, a, b, result, abserr, &defabs, &resabs);

  /*           test on accuracy. */

  dres = fabs(*result);
  errbnd = m_max(*epsabs, *epsrel * dres);
  *last = 1;
  rlist[1] = *result;
  elist[1] = *abserr;
  iord[1] = 1;
  if (*abserr <= epmach * 100. * defabs && *abserr > errbnd)
    *ier = 2;
  if (*limit == 1)
    *ier = 1;
  if (*ier != 0 || (*abserr <= errbnd && *abserr != resabs)
      || *abserr == 0.) goto L140;

  /*           initialization */
  /*           -------------- */

  rlist2[0] = *result;
  errmax = *abserr;
  maxerr = 1;
  area = *result;
  errsum = *abserr;
  *abserr = oflow;
  nrmax = 1;
  nres = 0;
  numrl2 = 2;
  ktmin = 0;
  extrap = FALSE;
  noext = FALSE;
  iroff1 = 0;
  iroff2 = 0;
  iroff3 = 0;
  ksgn = -1;
  if (dres >= (1. - epmach * 50.) * defabs) {
    ksgn = 1;
  }

  /*           main do-loop */
  /*           ------------ */

  for (*last = 2; *last <= *limit; ++(*last)) {

    /*           bisect the subinterval with the nrmax-th largest error estimate. */

    a1 = alist__[maxerr];
    b1 = (alist__[maxerr] + blist[maxerr]) * .5;
    a2 = b1;
    b2 = blist[maxerr];
    erlast = errmax;
    rdqk21(f, ex, &a1, &b1, &area1, &error1, &resabs, &defab1);
    rdqk21(f, ex, &a2, &b2, &area2, &error2, &resabs, &defab2);

    /*           improve previous approximations to integral
		 and error and test for accuracy. */

    area12 = area1 + area2;
    erro12 = error1 + error2;
    errsum = errsum + erro12 - errmax;
    area = area + area12 - rlist[maxerr];
    if (defab1 == error1 || defab2 == error2) {
      goto L15;
    }
    if (fabs(rlist[maxerr] - area12) > fabs(area12) * 1e-5 ||
	erro12 < errmax * .99) {
      goto L10;
    }
    if (extrap) {
      ++iroff2;
    }
    if (! extrap) {
      ++iroff1;
    }
  L10:
    if (*last > 10 && erro12 > errmax) {
      ++iroff3;
    }
  L15:
    rlist[maxerr] = area1;
    rlist[*last] = area2;
    errbnd = m_max(*epsabs, *epsrel * fabs(area));

    /*           test for roundoff error and eventually set error flag. */

    if (iroff1 + iroff2 >= 10 || iroff3 >= 20)
      *ier = 2;
    if (iroff2 >= 5)
      ierro = 3;

    /* set error flag in the case that the number of subintervals equals limit. */
    if (*last == *limit)
      *ier = 1;

    /*           set error flag in the case of bad integrand behaviour
		 at a point of the integration range. */

    if (m_max(fabs(a1), fabs(b2)) <=
	(epmach * 100. + 1.) * (fabs(a2) + uflow * 1e3)) {
      *ier = 4;
    }

    /*           append the newly-created intervals to the list. */

    if (error2 > error1) {
      alist__[maxerr] = a2;
      alist__[*last] = a1;
      blist[*last] = b1;
      rlist[maxerr] = area2;
      rlist[*last] = area1;
      elist[maxerr] = error2;
      elist[*last] = error1;
    } else {
      alist__[*last] = a2;
      blist[maxerr] = b1;
      blist[*last] = b2;
      elist[maxerr] = error1;
      elist[*last] = error2;
    }

    /*           call subroutine dqpsrt to maintain the descending ordering
		 in the list of error estimates and select the subinterval
		 with nrmax-th largest error estimate (to be bisected next). */

    /*L30:*/
    rdqpsrt(limit, last, &maxerr, &errmax, &elist[1], &iord[1], &nrmax);

    if (errsum <= errbnd)   goto L115;/* ***jump out of do-loop */
    if (*ier != 0)	    goto L100;/* ***jump out of do-loop */

    if (*last == 2)	    goto L80;
    if (noext)		    goto L90;

    erlarg -= erlast;
    if (fabs(b1 - a1) > small) {
      erlarg += erro12;
    }
    if (extrap) {
      goto L40;
    }

    /*           test whether the interval to be bisected next is the
		 smallest interval. */

    if (fabs(blist[maxerr] - alist__[maxerr]) > small) {
      goto L90;
    }
    extrap = TRUE;
    nrmax = 2;
  L40:
    if (ierro == 3 || erlarg <= ertest) {
      goto L60;
    }

    /*           the smallest interval has the largest error.
		 before bisecting decrease the sum of the errors over the
		 larger intervals (erlarg) and perform extrapolation. */

    id = nrmax;
    jupbnd = *last;
    if (*last > *limit / 2 + 2) {
      jupbnd = *limit + 3 - *last;
    }
    for (k = id; k <= jupbnd; ++k) {
      maxerr = iord[nrmax];
      errmax = elist[maxerr];
      if (fabs(blist[maxerr] - alist__[maxerr]) > small) {
	goto L90;/* ***jump out of do-loop */
      }
      ++nrmax;
      /* L50: */
    }

    /*           perform extrapolation. */

  L60:
    ++numrl2;
    rlist2[numrl2 - 1] = area;
    rdqelg(&numrl2, rlist2, &reseps, &abseps, res3la, &nres);
    ++ktmin;
    if (ktmin > 5 && *abserr < errsum * .001) {
      *ier = 5;
    }
    if (abseps >= *abserr) {
      goto L70;
    }
    ktmin = 0;
    *abserr = abseps;
    *result = reseps;
    correc = erlarg;
    ertest = m_max(*epsabs, *epsrel * fabs(reseps));
    if (*abserr <= ertest) {
      goto L100;/* ***jump out of do-loop */
    }

    /*           prepare bisection of the smallest interval. */

  L70:
    if (numrl2 == 1) {
      noext = TRUE;
    }
    if (*ier == 5) {
      goto L100;
    }
    maxerr = iord[1];
    errmax = elist[maxerr];
    nrmax = 1;
    extrap = FALSE;
    small *= .5;
    erlarg = errsum;
    goto L90;
  L80:
    small = fabs(*b - *a) * .375;
    erlarg = errsum;
    ertest = errbnd;
    rlist2[1] = area;
  L90:
    ;
  }


 L100:/*		set final result and error estimate. */
      /*		------------------------------------ */
  if (*abserr == oflow) 	goto L115;
  if (*ier + ierro == 0) 	goto L110;
  if (ierro == 3)
    *abserr += correc;
  if (*ier == 0)
    *ier = 3;
  if (*result != 0. && area != 0.) goto L105;
  if (*abserr > errsum) 	goto L115;
  if (area == 0.) 		goto L130;
  goto L110;

 L105:
  if (*abserr / fabs(*result) > errsum / fabs(area)) {
    goto L115;
  }

 L110:/*		test on divergence. */
  if (ksgn == -1 && m_max(fabs(*result), fabs(area)) <= defabs * .01) {
    goto L130;
  }
  if (.01 > *result / area || *result / area > 100. || errsum > fabs(area)) {
    *ier = 5;
  }
  goto L130;

 L115:/*		compute global integral sum. */
  *result = 0.;
  for (k = 1; k <= *last; ++k)
    *result += rlist[k];
  *abserr = errsum;
 L130:
  if (*ier > 2)
  L140:
    *neval = *last * 42 - 21;

  return;
}